

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.hh
# Opt level: O0

uint64_t __thiscall avro::ReaderImpl<avro::Validator>::readVarInt(ReaderImpl<avro::Validator> *this)

{
  uchar *in_RDI;
  uint64_t newbits;
  int shift;
  uint8_t val;
  uint64_t encoded;
  BufferReader *in_stack_ffffffffffffffe0;
  
  BufferReader::read<unsigned_char>(in_stack_ffffffffffffffe0,in_RDI);
  return 0;
}

Assistant:

uint64_t readVarInt() {
        uint64_t encoded = 0;
        uint8_t val = 0;
        int shift = 0;
        do {
            reader_.read(val);
            uint64_t newbits = static_cast<uint64_t>(val & 0x7f) << shift;
            encoded |= newbits;
            shift += 7;
        } while (val & 0x80);

        return encoded;
    }